

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_fa1a8::is_not_duplicate_number_predicate::operator()
          (is_not_duplicate_number_predicate *this,string *line,regex *re)

{
  bool bVar1;
  long lVar2;
  iterator __first;
  iterator __last;
  string_type local_a0;
  undefined1 local_80 [8];
  string_type number;
  anon_class_8_1_a847c8e5 case_group;
  undefined1 local_48 [8];
  smatch match;
  regex *re_local;
  string *line_local;
  is_not_duplicate_number_predicate *this_local;
  
  match._M_begin._M_current = (char *)re;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_48);
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_48,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     match._M_begin._M_current,0);
  if (bVar1) {
    number.field_2._8_8_ = local_48;
    operator()::anon_class_8_1_a847c8e5::operator()
              (&local_a0,(anon_class_8_1_a847c8e5 *)((long)&number.field_2 + 8),2);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      operator()::anon_class_8_1_a847c8e5::operator()
                ((string_type *)local_80,(anon_class_8_1_a847c8e5 *)((long)&number.field_2 + 8),3);
    }
    else {
      operator()::anon_class_8_1_a847c8e5::operator()
                ((string_type *)local_80,(anon_class_8_1_a847c8e5 *)((long)&number.field_2 + 8),2);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    __first = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&this->results);
    __last = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&this->results);
    bVar1 = std::operator()((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__first._M_current,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__last._M_current,(string_type *)local_80);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->results,(value_type *)local_80);
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (bVar1) goto LAB_003d3429;
  }
  this_local._7_1_ = 0;
LAB_003d3429:
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool operator()(const std::string &line, const std::regex &re) {
        std::smatch match;
        // if there are matches
        if (std::regex_search(line, match, re)) {
            // Depending the case can be in the 2nd or 3rd group
            const auto case_group = [&](size_t index){return std::ssub_match(match[index]).str();};
            const auto number = (case_group(2).size() == 0)
                    ? case_group(3)
                    : case_group(2);
            // Check if it's already defined
            // If it's not add it
            if (!std::any_of(std::begin(results), std::end(results)
                             , [&](const std::string& index){ return index == number; })) {
                results.push_back(number);
                return true;
            }
        }
        return false;
    }